

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_eval_xpath4(lyd_node *ctx_node,lyd_node *tree,lys_module *cur_mod,char *xpath,
                      LY_VALUE_FORMAT format,void *prefix_data,lyxp_var *vars,
                      LY_XPATH_TYPE *ret_type,ly_set **node_set,char **string,longdouble *number,
                      ly_bool *boolean)

{
  lyd_node **pplVar1;
  ly_ctx *local_120;
  ly_ctx *local_118;
  ly_ctx *local_110;
  ly_ctx *local_108;
  ly_ctx *local_100;
  uint local_f4;
  lyxp_expr *plStack_f0;
  uint32_t i;
  lyxp_expr *exp;
  lyxp_set xp_set;
  LY_ERR local_4c;
  LY_ERR ret;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  char *xpath_local;
  lys_module *cur_mod_local;
  lyd_node *tree_local;
  lyd_node *ctx_node_local;
  
  memset(&exp,0,0x90);
  plStack_f0 = (lyxp_expr *)0x0;
  if (tree == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree","lyd_eval_xpath4");
    return LY_EINVAL;
  }
  if (xpath == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","xpath","lyd_eval_xpath4")
    ;
    return LY_EINVAL;
  }
  if ((((((ret_type == (LY_XPATH_TYPE *)0x0) || (node_set == (ly_set **)0x0)) ||
        (string == (char **)0x0)) || ((number == (longdouble *)0x0 || (boolean == (ly_bool *)0x0))))
      && (((node_set == (ly_set **)0x0 ||
           ((string != (char **)0x0 || (number != (longdouble *)0x0)))) ||
          (boolean != (ly_bool *)0x0)))) &&
     ((((((node_set != (ly_set **)0x0 || (string == (char **)0x0)) || (number != (longdouble *)0x0))
        || (boolean != (ly_bool *)0x0)) &&
       (((node_set != (ly_set **)0x0 || (string != (char **)0x0)) ||
        ((number == (longdouble *)0x0 || (boolean != (ly_bool *)0x0)))))) &&
      (((node_set != (ly_set **)0x0 || (string != (char **)0x0)) ||
       ((number != (longdouble *)0x0 || (boolean == (ly_bool *)0x0)))))))) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "((ret_type && node_set && string && number && boolean) || (node_set && !string && !number && !boolean) || (!node_set && string && !number && !boolean) || (!node_set && !string && number && !boolean) || (!node_set && !string && !number && boolean))"
           ,"lyd_eval_xpath4");
    return LY_EINVAL;
  }
  if (tree->schema == (lysc_node *)0x0) {
    local_100 = (ly_ctx *)tree[2].schema;
  }
  else {
    local_100 = tree->schema->module->ctx;
  }
  local_4c = lyxp_expr_parse(local_100,xpath,0,'\x01',&stack0xffffffffffffff10);
  if (local_4c == LY_SUCCESS) {
    if (tree->schema == (lysc_node *)0x0) {
      local_108 = (ly_ctx *)tree[2].schema;
    }
    else {
      local_108 = tree->schema->module->ctx;
    }
    local_4c = lyxp_eval(local_108,plStack_f0,cur_mod,format,prefix_data,ctx_node,ctx_node,tree,vars
                         ,(lyxp_set *)&exp,1);
    if (local_4c == LY_SUCCESS) {
      if (node_set != (ly_set **)0x0) {
        if ((int)exp == 0) {
          local_4c = ly_set_new(node_set);
          if (local_4c != LY_SUCCESS) goto LAB_001326c8;
          pplVar1 = (lyd_node **)malloc((ulong)(uint)xp_set.val._8_4_ << 3);
          ((*node_set)->field_2).dnodes = pplVar1;
          if (((*node_set)->field_2).dnodes == (lyd_node **)0x0) {
            if (tree->schema == (lysc_node *)0x0) {
              local_110 = (ly_ctx *)tree[2].schema;
            }
            else {
              local_110 = tree->schema->module->ctx;
            }
            ly_log(local_110,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_eval_xpath4");
            local_4c = LY_EMEM;
            goto LAB_001326c8;
          }
          (*node_set)->size = xp_set.val._8_4_;
          for (local_f4 = 0; local_f4 < (uint)xp_set.val._8_4_; local_f4 = local_f4 + 1) {
            if ((*(int *)(CONCAT71(xp_set._9_7_,xp_set._8_1_) + (ulong)local_f4 * 0x10 + 8) == 3) &&
               (local_4c = ly_set_add(*node_set,
                                      *(void **)(CONCAT71(xp_set._9_7_,xp_set._8_1_) +
                                                (ulong)local_f4 * 0x10),'\x01',(uint32_t *)0x0),
               local_4c != LY_SUCCESS)) goto LAB_001326c8;
          }
          if (ret_type != (LY_XPATH_TYPE *)0x0) {
            *ret_type = LY_XPATH_NODE_SET;
          }
        }
        else if (((string == (char **)0x0) && (number == (longdouble *)0x0)) &&
                (boolean == (ly_bool *)0x0)) {
          if (tree->schema == (lysc_node *)0x0) {
            local_118 = (ly_ctx *)tree[2].schema;
          }
          else {
            local_118 = tree->schema->module->ctx;
          }
          ly_log(local_118,LY_LLERR,LY_EINVAL,"XPath \"%s\" result is not a node set.",xpath);
          local_4c = LY_EINVAL;
          goto LAB_001326c8;
        }
      }
      if (string != (char **)0x0) {
        if ((((int)exp != 4) && (node_set == (ly_set **)0x0)) &&
           (local_4c = lyxp_set_cast((lyxp_set *)&exp,LYXP_SET_STRING), local_4c != LY_SUCCESS))
        goto LAB_001326c8;
        if ((int)exp == 4) {
          *string = (char *)CONCAT71(xp_set._9_7_,xp_set._8_1_);
          xp_set._8_1_ = 0;
          xp_set._9_7_ = 0;
          if (ret_type != (LY_XPATH_TYPE *)0x0) {
            *ret_type = LY_XPATH_STRING;
          }
        }
      }
      if (number != (longdouble *)0x0) {
        if ((((int)exp != 3) && (node_set == (ly_set **)0x0)) &&
           (local_4c = lyxp_set_cast((lyxp_set *)&exp,LYXP_SET_NUMBER), local_4c != LY_SUCCESS))
        goto LAB_001326c8;
        if (((int)exp == 3) &&
           (*number = (longdouble)CONCAT28(xp_set.val._0_2_,CONCAT71(xp_set._9_7_,xp_set._8_1_)),
           ret_type != (LY_XPATH_TYPE *)0x0)) {
          *ret_type = LY_XPATH_NUMBER;
        }
      }
      if (((boolean != (ly_bool *)0x0) &&
          ((((int)exp == 2 || (node_set != (ly_set **)0x0)) ||
           (local_4c = lyxp_set_cast((lyxp_set *)&exp,LYXP_SET_BOOLEAN), local_4c == LY_SUCCESS))))
         && (((int)exp == 2 && (*boolean = xp_set._8_1_, ret_type != (LY_XPATH_TYPE *)0x0)))) {
        *ret_type = LY_XPATH_BOOLEAN;
      }
    }
  }
LAB_001326c8:
  lyxp_set_free_content((lyxp_set *)&exp);
  if (tree->schema == (lysc_node *)0x0) {
    local_120 = (ly_ctx *)tree[2].schema;
  }
  else {
    local_120 = tree->schema->module->ctx;
  }
  lyxp_expr_free(local_120,plStack_f0);
  return local_4c;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_eval_xpath4(const struct lyd_node *ctx_node, const struct lyd_node *tree, const struct lys_module *cur_mod,
        const char *xpath, LY_VALUE_FORMAT format, void *prefix_data, const struct lyxp_var *vars, LY_XPATH_TYPE *ret_type,
        struct ly_set **node_set, char **string, long double *number, ly_bool *boolean)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    struct lyxp_expr *exp = NULL;
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, tree, xpath, ((ret_type && node_set && string && number && boolean) ||
            (node_set && !string && !number && !boolean) || (!node_set && string && !number && !boolean) ||
            (!node_set && !string && number && !boolean) || (!node_set && !string && !number && boolean)), LY_EINVAL);

    /* parse expression */
    ret = lyxp_expr_parse((struct ly_ctx *)LYD_CTX(tree), xpath, 0, 1, &exp);
    LY_CHECK_GOTO(ret, cleanup);

    /* evaluate expression */
    ret = lyxp_eval(LYD_CTX(tree), exp, cur_mod, format, prefix_data, ctx_node, ctx_node, tree, vars, &xp_set,
            LYXP_IGNORE_WHEN);
    LY_CHECK_GOTO(ret, cleanup);

    /* return expected result type without or with casting */
    if (node_set) {
        /* node set */
        if (xp_set.type == LYXP_SET_NODE_SET) {
            /* transform into a set */
            LY_CHECK_GOTO(ret = ly_set_new(node_set), cleanup);
            (*node_set)->objs = malloc(xp_set.used * sizeof *(*node_set)->objs);
            LY_CHECK_ERR_GOTO(!(*node_set)->objs, LOGMEM(LYD_CTX(tree)); ret = LY_EMEM, cleanup);
            (*node_set)->size = xp_set.used;
            for (i = 0; i < xp_set.used; ++i) {
                if (xp_set.val.nodes[i].type == LYXP_NODE_ELEM) {
                    ret = ly_set_add(*node_set, xp_set.val.nodes[i].node, 1, NULL);
                    LY_CHECK_GOTO(ret, cleanup);
                }
            }
            if (ret_type) {
                *ret_type = LY_XPATH_NODE_SET;
            }
        } else if (!string && !number && !boolean) {
            LOGERR(LYD_CTX(tree), LY_EINVAL, "XPath \"%s\" result is not a node set.", xpath);
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    if (string) {
        if ((xp_set.type != LYXP_SET_STRING) && !node_set) {
            /* cast into string */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_STRING), cleanup);
        }
        if (xp_set.type == LYXP_SET_STRING) {
            /* string */
            *string = xp_set.val.str;
            xp_set.val.str = NULL;
            if (ret_type) {
                *ret_type = LY_XPATH_STRING;
            }
        }
    }

    if (number) {
        if ((xp_set.type != LYXP_SET_NUMBER) && !node_set) {
            /* cast into number */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_NUMBER), cleanup);
        }
        if (xp_set.type == LYXP_SET_NUMBER) {
            /* number */
            *number = xp_set.val.num;
            if (ret_type) {
                *ret_type = LY_XPATH_NUMBER;
            }
        }
    }

    if (boolean) {
        if ((xp_set.type != LYXP_SET_BOOLEAN) && !node_set) {
            /* cast into boolean */
            LY_CHECK_GOTO(ret = lyxp_set_cast(&xp_set, LYXP_SET_BOOLEAN), cleanup);
        }
        if (xp_set.type == LYXP_SET_BOOLEAN) {
            /* boolean */
            *boolean = xp_set.val.bln;
            if (ret_type) {
                *ret_type = LY_XPATH_BOOLEAN;
            }
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    lyxp_expr_free((struct ly_ctx *)LYD_CTX(tree), exp);
    return ret;
}